

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void newsym(int x,int y)

{
  monst *pmVar1;
  level *plVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  region *prVar6;
  obj *poVar7;
  trap *ptVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  xchar y_00;
  xchar worm_tail;
  rm *prVar13;
  xchar x_00;
  bool bVar14;
  bool bVar15;
  int local_44;
  
  plVar2 = level;
  if (in_mklev != '\0') {
    return;
  }
  if ((u._1052_1_ & 1) != 0) {
    if (u.ux != x) {
      return;
    }
    if (u.uy != y) {
      return;
    }
    goto LAB_00168424;
  }
  if (((u._1052_1_ & 2) != 0) &&
     (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 == '\0')) {
    bVar3 = is_pool(level,x,y);
    if (bVar3 == '\0') {
      return;
    }
    uVar11 = x - u.ux;
    uVar12 = -uVar11;
    if (0 < (int)uVar11) {
      uVar12 = uVar11;
    }
    uVar10 = y - u.uy;
    uVar11 = -uVar10;
    if (0 < (int)uVar10) {
      uVar11 = uVar10;
    }
    if (1 < uVar12) {
      return;
    }
    if (1 < uVar11) {
      return;
    }
  }
  prVar13 = plVar2->locations[x] + y;
  y_00 = (xchar)y;
  x_00 = (xchar)x;
  if ((viz_array[y][x] & 2U) != 0) {
    prVar6 = visible_region_at(level,x_00,y_00);
    uVar12 = *(uint *)&plVar2->locations[x][y].field_0x6;
    *(uint *)&plVar2->locations[x][y].field_0x6 = (uVar12 & 0xfffff7ff) + (uVar12 & 0x400) * 2;
    if ((u.ux == x) && (u.uy == y)) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001684b7;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001684ae;
LAB_001686e2:
        if ((u._1052_1_ & 1) == 0) {
          if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                 (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
               (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((u._1052_1_ & 4) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
LAB_00168883:
              if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
                 ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
                map_location(x,y,1);
                goto LAB_00168e0b;
              }
            }
          }
          else if ((u._1052_1_ & 4) != 0) goto LAB_00168883;
        }
      }
      else {
LAB_001684ae:
        if (ublindf != (obj *)0x0) {
LAB_001684b7:
          if (ublindf->oartifact == '\x1d') goto LAB_001686e2;
        }
      }
      map_location(x,y,0);
      display_self();
      goto LAB_00168e0b;
    }
    pmVar1 = level->monsters[x][y];
    if ((pmVar1 == (monst *)0x0) || (uVar12 = *(uint *)&pmVar1->field_0x60, (uVar12 >> 9 & 1) != 0))
    {
LAB_00168dda:
      if ((level->locations[x][y].field_0x6 & 8) == 0) {
        map_location(x,y,1);
      }
      else {
        map_invisible(x_00,y_00);
      }
    }
    else {
      iVar4 = 1;
      local_44 = 1;
      if ((pmVar1->mx == x) && (pmVar1->my == y)) {
        if (((uVar12 & 2) == 0) ||
           ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
          if (-1 < (char)uVar12) goto LAB_00168b50;
LAB_00168b5e:
          if (((pmVar1->data->mflags1 & 0x10000) == 0) &&
             ((poVar7 = which_armor(pmVar1,4), poVar7 == (obj *)0x0 ||
              (poVar7 = which_armor(pmVar1,4), poVar7->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00168bb7;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00168bb2;
LAB_00168ca0:
              if ((u.uprops[0x19].extrinsic == 0) ||
                 ((u.uprops[0x19].blocked != 0 ||
                  (iVar5 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), 0x40 < iVar5)
                  ))) goto LAB_00168cde;
            }
            else {
LAB_00168bb2:
              if (ublindf != (obj *)0x0) {
LAB_00168bb7:
                if (ublindf->oartifact == '\x1d') goto LAB_00168ca0;
              }
              if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                   (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                   youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0))
              goto LAB_00168ca0;
            }
          }
          else {
LAB_00168cde:
            bVar3 = match_warn_of_mon(pmVar1);
            if (bVar3 == '\0') {
              if (u.uprops[0x42].extrinsic == 0 && u.uprops[0x42].intrinsic == 0) goto LAB_00168d7d;
              local_44 = 2;
              goto LAB_00168d1a;
            }
          }
          worm_tail = '\0';
        }
        else {
          if (((char)uVar12 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_00168b5e;
LAB_00168b50:
          local_44 = iVar4;
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00168b5e;
LAB_00168d1a:
          worm_tail = '\0';
          iVar4 = local_44;
        }
      }
      else {
        worm_tail = '\x01';
        if (((uVar12 & 2) != 0) &&
           ((iVar4 = local_44, u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0 &&
            (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
LAB_00168d7d:
          if ((((u.uprops[0x18].extrinsic != 0 || u.uprops[0x18].intrinsic != 0) &&
               ((pmVar1->field_0x62 & 0x40) == 0)) &&
              (iVar4 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), iVar4 < 100)) &&
             ((pmVar1->mx == x && (pmVar1->my == y)))) {
            display_warning(pmVar1);
            goto LAB_00168e0b;
          }
          goto LAB_00168dda;
        }
      }
      local_44 = iVar4;
      if (((pmVar1->field_0x62 & 0x80) != 0) && (ptVar8 = t_at(level,x,y), ptVar8 != (trap *)0x0)) {
        uVar12 = (byte)ptVar8->field_0x8 & 0x1f;
        if ((uVar12 < 0x14) && ((0x81820U >> uVar12 & 1) != 0)) {
          ptVar8->field_0x8 = ptVar8->field_0x8 | 0x20;
        }
      }
      map_location(x,y,0);
      display_monster(x_00,y_00,pmVar1,local_44,worm_tail);
    }
LAB_00168e0b:
    if (prVar6 == (region *)0x0) {
      return;
    }
    if (plVar2->locations[x][y].typ < '\x17') {
      return;
    }
    if (0x14 < (uint)y || 0x4e < x - 1U) {
      return;
    }
    dbuf[(uint)y][(uint)x].effect = prVar6->effect_id;
    return;
  }
  if ((u.ux != x) || (u.uy != y)) {
    pmVar1 = level->monsters[x][y];
    if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
      if (((pmVar1->data->mflags1 & 0x10000) == 0) &&
         ((poVar7 = which_armor(pmVar1,4), poVar7 == (obj *)0x0 ||
          (poVar7 = which_armor(pmVar1,4), poVar7->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016854a;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00168545;
LAB_001688ff:
          if ((u.uprops[0x19].extrinsic == 0) ||
             ((u.uprops[0x19].blocked != 0 ||
              (iVar4 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), 0x40 < iVar4))))
          goto LAB_0016892e;
        }
        else {
LAB_00168545:
          if (ublindf != (obj *)0x0) {
LAB_0016854a:
            if (ublindf->oartifact == '\x1d') goto LAB_001688ff;
          }
          if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
               (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
               youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_001688ff;
        }
LAB_00168940:
        bVar9 = true;
      }
      else {
LAB_0016892e:
        bVar3 = match_warn_of_mon(pmVar1);
        if (bVar3 != '\0') goto LAB_00168940;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016896e;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00168969;
LAB_00168994:
          if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) || ((pmVar1->data->mflags3 & 0x200) == 0))
             || ((viz_array[pmVar1->my][pmVar1->mx] & 1U) == 0)) goto LAB_001689e1;
          uVar12 = *(uint *)&pmVar1->field_0x60;
          if ((((uVar12 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if ((-1 < (char)uVar12) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00168e65;
            goto LAB_001689e1;
          }
          if ((char)uVar12 < '\0') goto LAB_001689e1;
LAB_00168e65:
          bVar14 = (uVar12 >> 9 & 1) == 0;
          bVar15 = (u._1052_1_ & 0x20) == 0;
          bVar9 = bVar15 && bVar14;
          if (!bVar15 || !bVar14) goto LAB_001689e3;
        }
        else {
LAB_00168969:
          if (ublindf != (obj *)0x0) {
LAB_0016896e:
            if (ublindf->oartifact == '\x1d') goto LAB_00168994;
          }
LAB_001689e1:
          bVar9 = false;
LAB_001689e3:
          if ((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) goto LAB_00168a33;
        }
      }
      if ((pmVar1->mx == x) && (pmVar1->my == y)) {
        display_monster(x_00,y_00,pmVar1,(uint)!bVar9 * 2,'\0');
        return;
      }
    }
LAB_00168a33:
    pmVar1 = level->monsters[x][y];
    if ((((((pmVar1 != (monst *)0x0) && ((*(uint *)&pmVar1->field_0x60 >> 9 & 1) == 0)) &&
          (u.uprops[0x18].extrinsic != 0 || u.uprops[0x18].intrinsic != 0)) &&
         (((*(uint *)&pmVar1->field_0x60 & 0x400000) == 0 &&
          (iVar4 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), iVar4 < 100)))) &&
        (pmVar1->mx == x)) && (pmVar1->my == y)) {
      display_warning(pmVar1);
      return;
    }
    uVar12 = *(uint *)&plVar2->locations[x][y].field_0x6;
    if ((uVar12 >> 0xb & 1) == 0) {
      uVar11 = *(uint *)prVar13;
      if ((uVar11 & 0x3f) == 0xf) {
        if (plVar2->locations[x][y].typ != '\x19') goto LAB_00168aed;
        uVar11 = uVar11 & 0xffffffc0 | 0x10;
      }
      else {
        if (((uVar11 & 0x3f) != 0xe) || (plVar2->locations[x][y].typ != '\x18')) goto LAB_00168aed;
        uVar11 = uVar11 & 0xffffffc0 | 0xd;
      }
      *(uint *)prVar13 = uVar11;
      *(uint *)&plVar2->locations[x][y].field_0x6 = uVar12 & 0xfffff7fc;
    }
LAB_00168aed:
    dbuf_set_loc(x,y);
    return;
  }
  feel_location(u.ux,u.uy);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001683ff;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001683fa;
  }
  else {
LAB_001683fa:
    if (ublindf == (obj *)0x0) goto LAB_00168424;
LAB_001683ff:
    if (ublindf->oartifact != '\x1d') goto LAB_00168424;
  }
  if ((u._1052_1_ & 1) == 0) {
    if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
           (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
         (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
       (u.uprops[0xc].extrinsic == 0)) {
      if (((u._1052_1_ & 4) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_00168424;
    }
    else if ((u._1052_1_ & 4) == 0) goto LAB_00168424;
    if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
       ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
      return;
    }
  }
LAB_00168424:
  display_self();
  return;
}

Assistant:

void newsym(int x, int y)
{
    struct monst *mon;
    struct rm *loc = &(level->locations[x][y]);
    int see_it;
    xchar worm_tail;

    if (in_mklev) return;

    /* only permit updating the hero when swallowed */
    if (u.uswallow) {
	if (x == u.ux && y == u.uy) display_self();
	return;
    }
    if (Underwater && !Is_waterlevel(&u.uz)) {
	/* don't do anything unless (x,y) is an adjacent underwater position */
	int dx, dy;
	if (!is_pool(level, x,y)) return;
	dx = x - u.ux;	if (dx < 0) dx = -dx;
	dy = y - u.uy;	if (dy < 0) dy = -dy;
	if (dx > 1 || dy > 1) return;
    }

    /* Can physically see the location. */
    if (cansee(x,y)) {
        struct region* reg = visible_region_at(level, x, y);
	/*
	 * Don't use templit here:  E.g.
	 *
	 *	loc->waslit = !!(loc->lit || templit(x,y));
	 *
	 * Otherwise we have the "light pool" problem, where non-permanently
	 * lit areas just out of sight stay remembered as lit.  They should
	 * re-darken.
	 *
	 * Perhaps ALL areas should revert to their "unlit" look when
	 * out of sight.
	 */
	loc->waslit = (loc->lit!=0);	/* remember lit condition */

	if (x == u.ux && y == u.uy) {
	    if (senseself()) {
		map_location(x,y,0);	/* map *under* self */
		display_self();
	    } else
		/* we can see what is there */
		map_location(x,y,1);
	}
	else {
	    mon = m_at(level, x,y);
	    worm_tail = is_worm_tail(mon);
	    see_it = mon && (worm_tail
		? (!mon->minvis || See_invisible)
		: (mon_visible(mon)) || tp_sensemon(mon) || match_warn_of_mon(mon));
	    if (mon && (see_it || (!worm_tail && Detect_monsters))) {
		if (mon->mtrapped) {
		    struct trap *trap = t_at(level, x, y);
		    int tt = trap ? trap->ttyp : NO_TRAP;

		    /* if monster is in a physical trap, you see the trap too */
		    if (tt == BEAR_TRAP || tt == PIT ||
			tt == SPIKED_PIT ||tt == WEB) {
			trap->tseen = TRUE;
		    }
		}
		map_location(x,y,0);	/* map under the monster */
		/* also gets rid of any invisibility glyph */
		display_monster(x, y, mon, see_it ? PHYSICALLY_SEEN : DETECTED, worm_tail);
	    }
	    else if (mon && mon_warning(mon) && !is_worm_tail(mon))
	        display_warning(mon);
	    else if (level->locations[x][y].mem_invis)
		map_invisible(x, y);
	    else
		map_location(x,y,1);	/* map the location */
	}
	
	if (reg != NULL && ACCESSIBLE(loc->typ))
	    dbuf_set_effect(x, y, reg->effect_id);
    }

    /* Can't see the location. */
    else {
	if (x == u.ux && y == u.uy) {
	    feel_location(u.ux, u.uy);		/* forces an update */

	    if (senseself())
		display_self();
	}
	else if ((mon = m_at(level, x,y))
		&& ((see_it = (tp_sensemon(mon) || match_warn_of_mon(mon)
		    		|| (see_with_infrared(mon) && mon_visible(mon))))
		    || Detect_monsters)
		&& !is_worm_tail(mon)) {
	    /* Monsters are printed every time. */
	    /* This also gets rid of any invisibility glyph */
	    display_monster(x, y, mon, see_it ? 0 : DETECTED, 0);
	}
	else if ((mon = m_at(level, x,y)) && mon_warning(mon) &&
		 !is_worm_tail(mon)) {
	        display_warning(mon);
	}		

	/*
	 * If the location is remembered as being both dark (waslit is false)
	 * and lit (glyph is a lit room or lit corridor) then it was either:
	 *
	 *	(1) A dark location that the hero could see through night
	 *	    vision.
	 *
	 *	(2) Darkened while out of the hero's sight.  This can happen
	 *	    when cursed scroll of light is read.
	 *
	 * In either case, we have to manually correct the hero's memory to
	 * match waslit.  Deciding when to change waslit is non-trivial.
	 *
	 *  Note:  If flags.lit_corridor is set, then corridors act like room
	 *	   squares.  That is, they light up if in night vision range.
	 *	   If flags.lit_corridor is not set, then corridors will
	 *	   remain dark unless lit by a light spell and may darken
	 *	   again, as discussed above.
	 *
	 * These checks and changes must be here and not in back_to_glyph().
	 * They are dependent on the position being out of sight.
	 */
	else if (!loc->waslit) {
	    if (loc->mem_bg == S_litcorr && loc->typ == CORR) {
		loc->mem_bg = S_corr;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    } else if (loc->mem_bg == S_room && loc->typ == ROOM) {
		loc->mem_bg = S_darkroom;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	    else
		goto show_mem;
	} else {
show_mem:
	    dbuf_set_loc(x, y);
	}
    }
}